

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

DdNode * Ivy_FraigNodesAreEquivBdd_int(DdManager *dd,DdNode *bFunc,Vec_Ptr_t *vFront,int Level)

{
  undefined8 uVar1;
  void **ppvVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  void *pvVar4;
  DdNode **vector;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  void *Entry;
  int iVar10;
  long lVar11;
  
  p = Vec_PtrAlloc(100);
  iVar10 = 0;
  do {
    iVar8 = vFront->nSize;
    if (iVar8 <= iVar10) {
      iVar10 = p->nSize;
      iVar7 = dd->size;
      if (dd->size <= iVar10) {
        iVar7 = iVar10;
      }
      vector = (DdNode **)malloc((long)iVar7 << 3);
      for (lVar11 = 0; lVar9 = (long)iVar8, lVar11 < lVar9; lVar11 = lVar11 + 1) {
        pvVar4 = Vec_PtrEntry(vFront,(int)lVar11);
        if (*(uint *)((long)pvVar4 + 8) >> 0xb == Level) {
          pDVar5 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe)
                                             + 4));
          uVar1 = *(undefined8 *)((long)pvVar4 + 0x10);
          pDVar6 = Cudd_bddIthVar(dd,*(int *)((*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffe)
                                             + 4));
          pDVar5 = Cudd_bddAnd(dd,(DdNode *)((ulong)((uint)uVar1 & 1) ^ (ulong)pDVar5),
                               (DdNode *)
                               ((ulong)((uint)*(undefined8 *)((long)pvVar4 + 0x18) & 1) ^
                               (ulong)pDVar6));
        }
        else {
          pDVar5 = Cudd_bddIthVar(dd,*(int *)((long)pvVar4 + 4));
        }
        vector[lVar11] = pDVar5;
        Cudd_Ref(pDVar5);
        iVar8 = vFront->nSize;
      }
      if (iVar7 != dd->size) {
        __assert_fail("NewSize == dd->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0xaaa,
                      "DdNode *Ivy_FraigNodesAreEquivBdd_int(DdManager *, DdNode *, Vec_Ptr_t *, int)"
                     );
      }
      for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
        pDVar5 = Cudd_bddIthVar(dd,(int)lVar9);
        vector[lVar9] = pDVar5;
        Cudd_Ref(pDVar5);
        iVar7 = dd->size;
      }
      pDVar5 = Cudd_bddVectorCompose(dd,bFunc,vector);
      Cudd_Ref(pDVar5);
      iVar8 = 0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      for (; iVar10 != iVar8; iVar8 = iVar8 + 1) {
        pvVar4 = Vec_PtrEntry(p,iVar8);
        *(byte *)((long)pvVar4 + 8) = *(byte *)((long)pvVar4 + 8) & 0xdf;
        *(undefined4 *)((long)pvVar4 + 4) = 0;
      }
      for (lVar11 = 0; lVar11 < dd->size; lVar11 = lVar11 + 1) {
        Cudd_RecursiveDeref(dd,vector[lVar11]);
      }
      free(vector);
      free(vFront->pArray);
      iVar10 = p->nSize;
      ppvVar2 = p->pArray;
      vFront->nCap = p->nCap;
      vFront->nSize = iVar10;
      vFront->pArray = ppvVar2;
      p->nCap = 0;
      p->nSize = 0;
      p->pArray = (void **)0x0;
      Vec_PtrFree(p);
      Cudd_Deref(pDVar5);
      return pDVar5;
    }
    pvVar4 = Vec_PtrEntry(vFront,iVar10);
    uVar3 = *(uint *)((long)pvVar4 + 8);
    if (uVar3 >> 0xb == Level) {
      Entry = (void *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe);
      if ((*(uint *)((long)Entry + 8) & 0x20) == 0) {
        *(uint *)((long)Entry + 8) = *(uint *)((long)Entry + 8) | 0x20;
        *(int *)((long)Entry + 4) = p->nSize;
        Vec_PtrPush(p,Entry);
      }
      pvVar4 = (void *)(*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffe);
      uVar3 = *(uint *)((long)pvVar4 + 8);
      if ((uVar3 & 0x20) == 0) goto LAB_00653bef;
    }
    else {
LAB_00653bef:
      *(uint *)((long)pvVar4 + 8) = uVar3 | 0x20;
      *(int *)((long)pvVar4 + 4) = p->nSize;
      Vec_PtrPush(p,pvVar4);
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

DdNode * Ivy_FraigNodesAreEquivBdd_int( DdManager * dd, DdNode * bFunc, Vec_Ptr_t * vFront, int Level )
{
    DdNode ** pFuncs;
    DdNode * bFuncNew;
    Vec_Ptr_t * vTemp;
    Ivy_Obj_t * pObj, * pFanin;
    int i, NewSize;
    // create new frontier
    vTemp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
        {
            pObj->fMarkB = 1;
            pObj->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pObj );
            continue;
        }

        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin->fMarkB == 0 )
        {
            pFanin->fMarkB = 1;
            pFanin->TravId = Vec_PtrSize(vTemp);
            Vec_PtrPush( vTemp, pFanin );
        }
    }
    // collect the permutation
    NewSize = IVY_MAX(dd->size, Vec_PtrSize(vTemp));
    pFuncs = ABC_ALLOC( DdNode *, NewSize );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, i )
    {
        if ( (int)pObj->Level != Level )
            pFuncs[i] = Cudd_bddIthVar( dd, pObj->TravId );
        else
            pFuncs[i] = Cudd_bddAnd( dd, 
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin0(pObj)->TravId), Ivy_ObjFaninC0(pObj) ),
                Cudd_NotCond( Cudd_bddIthVar(dd, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ) );
        Cudd_Ref( pFuncs[i] );
    }
    // add the remaining vars
    assert( NewSize == dd->size );
    for ( i = Vec_PtrSize(vFront); i < dd->size; i++ )
    {
        pFuncs[i] = Cudd_bddIthVar( dd, i );
        Cudd_Ref( pFuncs[i] );
    }

    // create new
    bFuncNew = Cudd_bddVectorCompose( dd, bFunc, pFuncs ); Cudd_Ref( bFuncNew );
    // clean trav Id
    Vec_PtrForEachEntry( Ivy_Obj_t *, vTemp, pObj, i )
    {
        pObj->fMarkB = 0;
        pObj->TravId = 0;
    }
    // deref
    for ( i = 0; i < dd->size; i++ )
        Cudd_RecursiveDeref( dd, pFuncs[i] );
    ABC_FREE( pFuncs );

    ABC_FREE( vFront->pArray );
    *vFront = *vTemp;

    vTemp->nCap = vTemp->nSize = 0;
    vTemp->pArray = NULL;
    Vec_PtrFree( vTemp );

    Cudd_Deref( bFuncNew );
    return bFuncNew;
}